

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl_tree.c
# Opt level: O2

NodeAVL * avlInsert0(NodeAVL *nd,NodeAVL *newNd)

{
  bool bVar1;
  NodeAVL *pNVar2;
  
  if (nd != (NodeAVL *)0x0) {
    bVar1 = nd->key < newNd->key || nd->key == newNd->key;
    pNVar2 = avlInsert0((&nd->left)[bVar1],newNd);
    (&nd->left)[bVar1] = pNVar2;
    pNVar2->parent = nd;
    pNVar2 = avlBalance(nd);
    return pNVar2;
  }
  return newNd;
}

Assistant:

static
NodeAVL* avlInsert0( NodeAVL* nd, NodeAVL *newNd ){
    if( !nd ) return newNd;
    if( newNd->key < nd->key ){
        nd->left = avlInsert0( nd->left, newNd );
        nd->left->parent = nd;
    } else {
        nd->right = avlInsert0( nd->right, newNd );
        nd->right->parent = nd;
    }
    return avlBalance(nd);
}